

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_type_vector_(MPIABI_Fint *count,MPIABI_Fint *blocklength,MPIABI_Fint *stride,
                        MPIABI_Fint *oldtype,MPIABI_Fint *newtype,MPIABI_Fint *ierror)

{
  mpi_type_vector_();
  return;
}

Assistant:

void mpiabi_type_vector_(
  const MPIABI_Fint * count,
  const MPIABI_Fint * blocklength,
  const MPIABI_Fint * stride,
  const MPIABI_Fint * oldtype,
  MPIABI_Fint * newtype,
  MPIABI_Fint * ierror
) {
  return mpi_type_vector_(
    count,
    blocklength,
    stride,
    oldtype,
    newtype,
    ierror
  );
}